

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O0

bool hasSpecialChars(QString *arg,uchar (*iqm) [16])

{
  bool bVar1;
  char16_t c;
  qsizetype qVar2;
  QChar *pQVar3;
  uchar (*in_RSI) [16];
  QString *in_RDI;
  int x;
  int local_1c;
  
  qVar2 = QString::size(in_RDI);
  local_1c = (int)qVar2;
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return false;
    }
    pQVar3 = QString::unicode((QString *)0x2c36a1);
    c = QChar::unicode(pQVar3 + local_1c);
    bVar1 = isSpecialChar(c,in_RSI);
  } while (!bVar1);
  return true;
}

Assistant:

inline static
bool hasSpecialChars(const QString &arg, const uchar (&iqm)[16])
{
    for (int x = arg.size() - 1; x >= 0; --x) {
        if (isSpecialChar(arg.unicode()[x].unicode(), iqm))
            return true;
    }
    return false;
}